

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  pointer pcVar1;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  char cVar8;
  string local_f8;
  size_type *local_d8;
  string file;
  long local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  int local_74;
  size_type *psStack_70;
  int number_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_d8 = &file._M_string_length;
  file._M_dataplus._M_p = (pointer)0x0;
  file._M_string_length._0_1_ = 0;
  local_74 = number;
  if (number == 0) {
    pcVar1 = (base_name->pathname_)._M_dataplus._M_p;
    psStack_70 = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff90,pcVar1,
               pcVar1 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&stack0xffffffffffffff90);
    plVar3 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff90);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      local_40._M_allocated_capacity = *psVar4;
      local_40._8_8_ = plVar3[3];
      __str.field_2._8_8_ = &local_40;
    }
    else {
      local_40._M_allocated_capacity = *psVar4;
      __str.field_2._8_8_ = (size_type *)*plVar3;
    }
    local_48 = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d8,(string *)(__str.field_2._M_local_buf + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str.field_2._8_8_ != &local_40) {
      operator_delete((void *)__str.field_2._8_8_,local_40._M_allocated_capacity + 1);
    }
    if (psStack_70 != &__str._M_string_length) {
      operator_delete(psStack_70,__str._M_string_length + 1);
    }
    goto LAB_0010db51;
  }
  pcVar1 = (base_name->pathname_)._M_dataplus._M_p;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (base_name->pathname_)._M_string_length);
  std::__cxx11::string::append((char *)&local_98);
  StreamableToString<int>(&local_f8,&local_74);
  uVar6 = 0xf;
  if (local_98 != local_88) {
    uVar6 = local_88[0];
  }
  if (uVar6 < local_f8._M_string_length + local_90) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar5 = local_f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_f8._M_string_length + local_90) goto LAB_0010d8ce;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_0010d8ce:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_f8._M_dataplus._M_p);
  }
  file.field_2._8_8_ = &local_a8;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_a8 = *plVar3;
    uStack_a0 = puVar2[3];
  }
  else {
    local_a8 = *plVar3;
    file.field_2._8_8_ = (long *)*puVar2;
  }
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append(file.field_2._M_local_buf + 8);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    __str._M_string_length = *psVar4;
    __str.field_2._M_allocated_capacity = plVar3[3];
    psStack_70 = &__str._M_string_length;
  }
  else {
    __str._M_string_length = *psVar4;
    psStack_70 = (size_type *)*plVar3;
  }
  __str._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff90);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    local_40._M_allocated_capacity = *psVar4;
    local_40._8_8_ = plVar3[3];
    __str.field_2._8_8_ = &local_40;
  }
  else {
    local_40._M_allocated_capacity = *psVar4;
    __str.field_2._8_8_ = (size_type *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)(__str.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_,local_40._M_allocated_capacity + 1);
  }
  if (psStack_70 != &__str._M_string_length) {
    operator_delete(psStack_70,__str._M_string_length + 1);
  }
  if ((long *)file.field_2._8_8_ != &local_a8) {
    operator_delete((void *)file.field_2._8_8_,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
LAB_0010db51:
  __str.field_2._8_8_ = &local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&__str.field_2 + 8),local_d8,file._M_dataplus._M_p + (long)local_d8);
  uVar5 = __str.field_2._8_8_;
  if (local_48 != 0) {
    lVar7 = 0;
    do {
      cVar8 = *(char *)(__str.field_2._8_8_ + lVar7);
      if (((cVar8 != '/') || (cVar8 = '/', uVar5 == __str.field_2._8_8_)) ||
         (*(char *)(uVar5 + -1) != '/')) {
        *(char *)uVar5 = cVar8;
        uVar5 = uVar5 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (local_48 != lVar7);
  }
  *(char *)uVar5 = '\0';
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)((long)&__str.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_,local_40._M_allocated_capacity + 1);
  }
  if (local_d8 != &file._M_string_length) {
    operator_delete(local_d8,CONCAT71(file._M_string_length._1_7_,(undefined1)file._M_string_length)
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}